

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::IfExceptExpr::~IfExceptExpr(IfExceptExpr *this)

{
  IfExceptExpr *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExceptExpr_01e54198;
  Var::~Var(&this->except_var);
  intrusive_list<wabt::Expr>::~intrusive_list(&this->false_);
  Block::~Block(&this->true_);
  ExprMixin<(wabt::ExprType)20>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)20>);
  return;
}

Assistant:

explicit IfExceptExpr(const Location& loc = Location())
      : ExprMixin<ExprType::IfExcept>(loc) {}